

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

void updatewindow(zng_stream *strm,uint8_t *end,uint32_t len,int32_t cksum)

{
  internal_state *piVar1;
  internal_state *piVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t *__src;
  uint uVar5;
  uint8_t *__dest;
  ulong uVar6;
  uint uVar7;
  
  piVar1 = strm->state;
  uVar5 = piVar1->w_size;
  if (uVar5 == 0) {
    uVar5 = 1 << ((byte)piVar1->block_open & 0x1f);
    piVar1->w_size = uVar5;
  }
  if (len < uVar5) {
    uVar5 = uVar5 - piVar1->lookahead;
    uVar7 = len;
    if (uVar5 < len) {
      uVar7 = uVar5;
    }
    uVar6 = (ulong)uVar7;
    __dest = (uint8_t *)((ulong)piVar1->lookahead + *(long *)&piVar1->high_water);
    __src = end + -(ulong)len;
    if (cksum == 0) {
      memcpy(__dest,__src,uVar6);
      if (uVar5 < len) {
        uVar7 = len - uVar7;
        memcpy(*(void **)&piVar1->high_water,end + -(ulong)uVar7,(ulong)uVar7);
        goto LAB_00135a4e;
      }
    }
    else {
      if (uVar7 != 0) {
        if (piVar1->pending_buf_size == 0) {
          uVar3 = (*functable.adler32_fold_copy)(piVar1->wrap,__dest,__src,uVar6);
          piVar1->wrap = (int)(ulong)uVar3;
          piVar1->gzindex = (int)((ulong)uVar3 >> 0x20);
          strm->adler = uVar3;
        }
        else {
          (*functable.crc32_fold_copy)((crc32_fold_s *)&piVar1->level,__dest,__src,uVar6);
        }
      }
      if (uVar5 < len) {
        uVar7 = len - uVar7;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar6 = (ulong)uVar7;
          piVar2 = strm->state;
          if (piVar2->pending_buf_size == 0) {
            uVar3 = (*functable.adler32_fold_copy)
                              (piVar2->wrap,*(uint8_t **)&piVar1->high_water,end + -uVar6,uVar6);
            piVar2->wrap = (int)(ulong)uVar3;
            piVar2->gzindex = (int)((ulong)uVar3 >> 0x20);
            strm->adler = uVar3;
          }
          else {
            (*functable.crc32_fold_copy)
                      ((crc32_fold_s *)&piVar2->level,*(uint8_t **)&piVar1->high_water,end + -uVar6,
                       uVar6);
          }
        }
LAB_00135a4e:
        piVar1->lookahead = uVar7;
        goto LAB_00135a52;
      }
    }
    uVar4 = piVar1->lookahead + uVar7;
    uVar5 = 0;
    if (uVar4 != piVar1->w_size) {
      uVar5 = uVar4;
    }
    piVar1->lookahead = uVar5;
    if (piVar1->w_size <= piVar1->w_mask) {
      return;
    }
    uVar7 = piVar1->w_mask + uVar7;
  }
  else {
    if (cksum == 0) {
      memcpy(*(void **)&piVar1->high_water,end + -(ulong)uVar5,(ulong)uVar5);
    }
    else {
      uVar7 = len - uVar5;
      if (uVar5 <= len && uVar7 != 0) {
        if (piVar1->pending_buf_size == 0) {
          uVar3 = (*functable.adler32)(piVar1->wrap,end + -(ulong)len,(ulong)uVar7);
          piVar1->wrap = (int)(ulong)uVar3;
          piVar1->gzindex = (int)((ulong)uVar3 >> 0x20);
          strm->adler = uVar3;
        }
        else {
          (*functable.crc32_fold)((crc32_fold_s *)&piVar1->level,end + -(ulong)len,(ulong)uVar7,0);
        }
      }
      uVar6 = (ulong)piVar1->w_size;
      if (uVar6 != 0) {
        piVar2 = strm->state;
        if (piVar2->pending_buf_size == 0) {
          uVar3 = (*functable.adler32_fold_copy)
                            (piVar2->wrap,*(uint8_t **)&piVar1->high_water,end + -uVar6,uVar6);
          piVar2->wrap = (int)(ulong)uVar3;
          piVar2->gzindex = (int)((ulong)uVar3 >> 0x20);
          strm->adler = uVar3;
        }
        else {
          (*functable.crc32_fold_copy)
                    ((crc32_fold_s *)&piVar2->level,*(uint8_t **)&piVar1->high_water,end + -uVar6,
                     uVar6);
        }
      }
    }
    piVar1->lookahead = 0;
LAB_00135a52:
    uVar7 = piVar1->w_size;
  }
  piVar1->w_mask = uVar7;
  return;
}

Assistant:

static void updatewindow(PREFIX3(stream) *strm, const uint8_t *end, uint32_t len, int32_t cksum) {
    struct inflate_state *state;
    uint32_t dist;

    state = (struct inflate_state *)strm->state;

    /* if window not in use yet, initialize */
    if (state->wsize == 0)
        state->wsize = 1U << state->wbits;

    /* len state->wsize or less output bytes into the circular window */
    if (len >= state->wsize) {
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * it (s/390 being the primary exception to this) */
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            /* We have to split the checksum over non-copied and copied bytes */
            if (len > state->wsize)
                inf_chksum(strm, end - len, len - state->wsize);
            inf_chksum_cpy(strm, state->window, end - state->wsize, state->wsize);
        } else {
            memcpy(state->window, end - state->wsize, state->wsize);
        }

        state->wnext = 0;
        state->whave = state->wsize;
    } else {
        dist = state->wsize - state->wnext;
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * We need to maintain the correct order here for the checksum */
        dist = MIN(dist, len);
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            inf_chksum_cpy(strm, state->window + state->wnext, end - len, dist);
        } else {
            memcpy(state->window + state->wnext, end - len, dist);
        }
        len -= dist;
        if (len) {
            if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
                inf_chksum_cpy(strm, state->window, end - len, len);
            } else {
                memcpy(state->window, end - len, len);
            }

            state->wnext = len;
            state->whave = state->wsize;
        } else {
            state->wnext += dist;
            if (state->wnext == state->wsize)
                state->wnext = 0;
            if (state->whave < state->wsize)
                state->whave += dist;
        }
    }
}